

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderNonMessageField
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  TypeInfo *pTVar4;
  string *psVar5;
  size_t sVar6;
  converter *this_00;
  char *size;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  ulong *puVar10;
  long lVar11;
  undefined4 extraout_var;
  EnumValue *pEVar12;
  int64 iVar13;
  char *pcVar14;
  ulong uVar15;
  pointer pcVar16;
  uint32 uVar17;
  CodedInputStream *pCVar18;
  _Alloc_hider _Var19;
  undefined1 auVar20 [8];
  pair<unsigned_long,_bool> pVar21;
  StringPiece input;
  string local_98;
  pointer local_78;
  undefined1 local_70 [8];
  string strbuffer;
  ulong local_40;
  uint64 buffer64;
  uint32 buffer32;
  
  strbuffer.field_2._8_8_ = field_name.length_;
  pcVar14 = field_name.ptr_;
  local_70 = (undefined1  [8])&strbuffer._M_string_length;
  strbuffer._M_dataplus._M_p = (pointer)0x0;
  strbuffer._M_string_length._0_1_ = 0;
  switch(field->kind_) {
  case 1:
    pCVar18 = this->stream_;
    puVar10 = (ulong *)pCVar18->buffer_;
    if (*(int *)&pCVar18->buffer_end_ - (int)puVar10 < 8) {
      io::CodedInputStream::ReadLittleEndian64Fallback(pCVar18,&local_40);
    }
    else {
      local_40 = *puVar10;
      pCVar18->buffer_ = (uint8 *)(puVar10 + 1);
    }
    (*ow->_vptr_ObjectWriter[0xb])(local_40,ow,pcVar14,strbuffer.field_2._8_8_);
    break;
  case 2:
    pCVar18 = this->stream_;
    puVar9 = (uint *)pCVar18->buffer_;
    if (*(int *)&pCVar18->buffer_end_ - (int)puVar9 < 4) {
      io::CodedInputStream::ReadLittleEndian32Fallback(pCVar18,(uint32 *)((long)&buffer64 + 4));
    }
    else {
      buffer64._4_4_ = *puVar9;
      pCVar18->buffer_ = (uint8 *)(puVar9 + 1);
    }
    (*ow->_vptr_ObjectWriter[0xc])((ulong)buffer64._4_4_,ow,pcVar14,strbuffer.field_2._8_8_);
    break;
  case 3:
    pCVar18 = this->stream_;
    puVar3 = pCVar18->buffer_;
    if ((puVar3 < pCVar18->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      puVar10 = (ulong *)(puVar3 + 1);
LAB_003249b0:
      pCVar18->buffer_ = (uint8 *)puVar10;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(pCVar18);
      local_40 = pVar21.first;
    }
    goto LAB_003249b3;
  case 4:
    pCVar18 = this->stream_;
    puVar3 = pCVar18->buffer_;
    if ((puVar3 < pCVar18->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      puVar10 = (ulong *)(puVar3 + 1);
LAB_00324b22:
      pCVar18->buffer_ = (uint8 *)puVar10;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(pCVar18);
      local_40 = pVar21.first;
    }
    goto LAB_00324b25;
  case 5:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        buffer64._4_4_ = (uint)bVar1;
        puVar9 = (uint *)(pbVar2 + 1);
        goto LAB_00324b69;
      }
    }
    else {
      uVar17 = 0;
    }
    iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
    buffer64._4_4_ = (uint)iVar13;
    goto LAB_00324b6c;
  case 6:
    pCVar18 = this->stream_;
    puVar10 = (ulong *)pCVar18->buffer_;
    if (7 < *(int *)&pCVar18->buffer_end_ - (int)puVar10) {
      local_40 = *puVar10;
      puVar10 = puVar10 + 1;
      goto LAB_00324b22;
    }
    io::CodedInputStream::ReadLittleEndian64Fallback(pCVar18,&local_40);
LAB_00324b25:
    lVar11 = 0x50;
    uVar15 = local_40;
    goto LAB_00324b2e;
  case 7:
    pCVar18 = this->stream_;
    puVar9 = (uint *)pCVar18->buffer_;
    if (*(int *)&pCVar18->buffer_end_ - (int)puVar9 < 4) {
      io::CodedInputStream::ReadLittleEndian32Fallback(pCVar18,(uint32 *)((long)&buffer64 + 4));
    }
    else {
      buffer64._4_4_ = *puVar9;
      puVar9 = puVar9 + 1;
LAB_00324a6b:
      pCVar18->buffer_ = (uint8 *)puVar9;
    }
    goto LAB_00324a6e;
  case 8:
    pCVar18 = this->stream_;
    puVar3 = pCVar18->buffer_;
    if ((puVar3 < pCVar18->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      pCVar18->buffer_ = puVar3 + 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(pCVar18);
      local_40 = pVar21.first;
    }
    (*ow->_vptr_ObjectWriter[6])(ow,pcVar14,strbuffer.field_2._8_8_,(ulong)(local_40 != 0));
    break;
  case 9:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00324ed1;
      buffer64._4_4_ = (uint)bVar1;
      pCVar18->buffer_ = pbVar2 + 1;
    }
    else {
      uVar17 = 0;
LAB_00324ed1:
      iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
      buffer64._4_4_ = (uint)iVar13;
    }
    io::CodedInputStream::ReadString(this->stream_,(string *)local_70,buffer64._4_4_);
    _Var19 = strbuffer._M_dataplus;
    auVar20 = local_70;
    lVar11 = 0x68;
    if ((long)strbuffer._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)strbuffer._M_dataplus._M_p,"size_t to int conversion")
      ;
    }
    goto LAB_00324f0b;
  case 0xc:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00324e93;
      buffer64._4_4_ = (uint)bVar1;
      pCVar18->buffer_ = pbVar2 + 1;
    }
    else {
      uVar17 = 0;
LAB_00324e93:
      iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
      buffer64._4_4_ = (uint)iVar13;
    }
    io::CodedInputStream::ReadString(this->stream_,(string *)local_70,buffer64._4_4_);
    _Var19 = strbuffer._M_dataplus;
    auVar20 = local_70;
    lVar11 = 0x70;
    if ((long)strbuffer._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)strbuffer._M_dataplus._M_p,"size_t to int conversion")
      ;
    }
LAB_00324f0b:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar11))
              (ow,pcVar14,strbuffer.field_2._8_8_,auVar20,_Var19._M_p);
    break;
  case 0xd:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        buffer64._4_4_ = (uint)bVar1;
        puVar9 = (uint *)(pbVar2 + 1);
        goto LAB_00324a6b;
      }
    }
    else {
      uVar17 = 0;
    }
    iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
    buffer64._4_4_ = (uint)iVar13;
LAB_00324a6e:
    lVar11 = 0x40;
    uVar7 = buffer64._4_4_;
    goto LAB_00324b74;
  case 0xe:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00324c89;
      buffer64._4_4_ = (uint)bVar1;
      pCVar18->buffer_ = pbVar2 + 1;
    }
    else {
      uVar17 = 0;
LAB_00324c89:
      iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
      buffer64._4_4_ = (uint)iVar13;
    }
    iVar8 = std::__cxx11::string::compare((char *)(field->type_url_).ptr_);
    if (iVar8 == 0) {
      (*ow->_vptr_ObjectWriter[0xf])(ow,pcVar14,strbuffer.field_2._8_8_);
    }
    else {
      pTVar4 = this->typeinfo_;
      psVar5 = (field->type_url_).ptr_;
      pcVar16 = (psVar5->_M_dataplus)._M_p;
      sVar6 = psVar5->_M_string_length;
      local_78 = pcVar16;
      if ((long)sVar6 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar6,"size_t to int conversion");
      }
      iVar8 = (*pTVar4->_vptr_TypeInfo[4])(pTVar4,local_78,sVar6);
      if ((Enum *)CONCAT44(extraout_var,iVar8) == (Enum *)0x0) {
        if (this->render_unknown_enum_values_ == true) {
          (*ow->_vptr_ObjectWriter[7])(ow,pcVar14,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
        }
      }
      else {
        pEVar12 = anon_unknown_4::FindEnumValueByNumber
                            ((Enum *)CONCAT44(extraout_var,iVar8),buffer64._4_4_);
        if (pEVar12 == (EnumValue *)0x0) {
          if (this->render_unknown_enum_values_ != true) break;
        }
        else if (this->use_ints_for_enums_ == false) {
          if (this->use_lower_camel_for_enums_ == true) {
            psVar5 = (pEVar12->name_).ptr_;
            this_00 = (converter *)(psVar5->_M_dataplus)._M_p;
            size = (char *)psVar5->_M_string_length;
            if ((long)size < 0) {
              StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
            }
            input.length_ = (stringpiece_ssize_type)pcVar16;
            input.ptr_ = size;
            EnumValueNameToLowerCamelCase_abi_cxx11_(&local_98,this_00,input);
            _Var19._M_p = local_98._M_dataplus._M_p;
            if ((long)local_98._M_string_length < 0) {
              StringPiece::LogFatalSizeTooBig(local_98._M_string_length,"size_t to int conversion");
            }
            (*ow->_vptr_ObjectWriter[0xd])
                      (ow,pcVar14,strbuffer.field_2._8_8_,_Var19._M_p,local_98._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
          }
          else {
            psVar5 = (pEVar12->name_).ptr_;
            pcVar16 = (psVar5->_M_dataplus)._M_p;
            sVar6 = psVar5->_M_string_length;
            if ((long)sVar6 < 0) {
              StringPiece::LogFatalSizeTooBig(sVar6,"size_t to int conversion");
            }
            (*ow->_vptr_ObjectWriter[0xd])(ow,pcVar14,strbuffer.field_2._8_8_,pcVar16,sVar6);
          }
          break;
        }
        (*ow->_vptr_ObjectWriter[7])(ow,pcVar14,strbuffer.field_2._8_8_,(ulong)buffer64._4_4_);
      }
    }
    break;
  case 0xf:
    pCVar18 = this->stream_;
    puVar9 = (uint *)pCVar18->buffer_;
    if (*(int *)&pCVar18->buffer_end_ - (int)puVar9 < 4) {
      io::CodedInputStream::ReadLittleEndian32Fallback(pCVar18,(uint32 *)((long)&buffer64 + 4));
    }
    else {
      buffer64._4_4_ = *puVar9;
      puVar9 = puVar9 + 1;
LAB_00324b69:
      pCVar18->buffer_ = (uint8 *)puVar9;
    }
LAB_00324b6c:
    lVar11 = 0x38;
    uVar7 = buffer64._4_4_;
LAB_00324b74:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar11))(ow,pcVar14,strbuffer.field_2._8_8_,uVar7);
    break;
  case 0x10:
    pCVar18 = this->stream_;
    puVar10 = (ulong *)pCVar18->buffer_;
    if (7 < *(int *)&pCVar18->buffer_end_ - (int)puVar10) {
      local_40 = *puVar10;
      puVar10 = puVar10 + 1;
      goto LAB_003249b0;
    }
    io::CodedInputStream::ReadLittleEndian64Fallback(pCVar18,&local_40);
LAB_003249b3:
    lVar11 = 0x48;
    uVar15 = local_40;
LAB_00324b2e:
    (**(code **)((long)ow->_vptr_ObjectWriter + lVar11))(ow,pcVar14,strbuffer.field_2._8_8_,uVar15);
    break;
  case 0x11:
    pCVar18 = this->stream_;
    pbVar2 = pCVar18->buffer_;
    if (pbVar2 < pCVar18->buffer_end_) {
      bVar1 = *pbVar2;
      uVar17 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_00324e62;
      buffer64._4_4_ = (uint)bVar1;
      pCVar18->buffer_ = pbVar2 + 1;
    }
    else {
      uVar17 = 0;
LAB_00324e62:
      iVar13 = io::CodedInputStream::ReadVarint32Fallback(pCVar18,uVar17);
      buffer64._4_4_ = (uint)iVar13;
    }
    lVar11 = 0x38;
    uVar7 = -(buffer64._4_4_ & 1) ^ buffer64._4_4_ >> 1;
    goto LAB_00324b74;
  case 0x12:
    pCVar18 = this->stream_;
    puVar3 = pCVar18->buffer_;
    if ((puVar3 < pCVar18->buffer_end_) && (local_40 = (ulong)(char)*puVar3, -1 < (long)local_40)) {
      pCVar18->buffer_ = puVar3 + 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(pCVar18);
      local_40 = pVar21.first;
    }
    lVar11 = 0x48;
    uVar15 = -(ulong)((uint)local_40 & 1) ^ local_40 >> 1;
    goto LAB_00324b2e;
  }
  Status::Status(__return_storage_ptr__);
  if (local_70 != (undefined1  [8])&strbuffer._M_string_length) {
    operator_delete((void *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderNonMessageField(
    const google::protobuf::Field* field, StringPiece field_name,
    ObjectWriter* ow) const {
  // Temporary buffers of different types.
  uint32 buffer32;
  uint64 buffer64;
  std::string strbuffer;
  switch (field->kind()) {
    case google::protobuf::Field::TYPE_BOOL: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderBool(field_name, buffer64 != 0);
      break;
    }
    case google::protobuf::Field::TYPE_INT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_INT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_UINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_UINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SINT32: {
      stream_->ReadVarint32(&buffer32);
      ow->RenderInt32(field_name, WireFormatLite::ZigZagDecode32(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SINT64: {
      stream_->ReadVarint64(&buffer64);
      ow->RenderInt64(field_name, WireFormatLite::ZigZagDecode64(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderInt32(field_name, bit_cast<int32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_SFIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderInt64(field_name, bit_cast<int64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED32: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_FIXED64: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderUint64(field_name, bit_cast<uint64>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      stream_->ReadLittleEndian32(&buffer32);
      ow->RenderFloat(field_name, bit_cast<float>(buffer32));
      break;
    }
    case google::protobuf::Field::TYPE_DOUBLE: {
      stream_->ReadLittleEndian64(&buffer64);
      ow->RenderDouble(field_name, bit_cast<double>(buffer64));
      break;
    }
    case google::protobuf::Field::TYPE_ENUM: {
      stream_->ReadVarint32(&buffer32);

      // If the field represents an explicit NULL value, render null.
      if (field->type_url() == kStructNullValueTypeUrl) {
        ow->RenderNull(field_name);
        break;
      }

      // Get the nested enum type for this field.
      // TODO(skarvaje): Avoid string manipulation. Find ways to speed this
      // up.
      const google::protobuf::Enum* en =
          typeinfo_->GetEnumByTypeUrl(field->type_url());
      // Lookup the name of the enum, and render that. Unknown enum values
      // are printed as integers.
      if (en != nullptr) {
        const google::protobuf::EnumValue* enum_value =
            FindEnumValueByNumber(*en, buffer32);
        if (enum_value != nullptr) {
          if (use_ints_for_enums_) {
            ow->RenderInt32(field_name, buffer32);
          } else if (use_lower_camel_for_enums_) {
            ow->RenderString(field_name,
                             EnumValueNameToLowerCamelCase(enum_value->name()));
          } else {
            ow->RenderString(field_name, enum_value->name());
          }
        } else if (render_unknown_enum_values_) {
          ow->RenderInt32(field_name, buffer32);
        }
      } else if (render_unknown_enum_values_) {
        ow->RenderInt32(field_name, buffer32);
      }
      break;
    }
    case google::protobuf::Field::TYPE_STRING: {
      stream_->ReadVarint32(&buffer32);  // string size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderString(field_name, strbuffer);
      break;
    }
    case google::protobuf::Field::TYPE_BYTES: {
      stream_->ReadVarint32(&buffer32);  // bytes size.
      stream_->ReadString(&strbuffer, buffer32);
      ow->RenderBytes(field_name, strbuffer);
      break;
    }
    default:
      break;
  }
  return util::Status();
}